

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUseMangledMesaCommand.cxx
# Opt level: O1

void __thiscall
cmUseMangledMesaCommand::CopyAndFullPathMesaHeader
          (cmUseMangledMesaCommand *this,char *source,char *outdir)

{
  bool bVar1;
  size_t sVar2;
  ostream *poVar3;
  string gfile;
  string inLine;
  string tempOutputFile;
  string includeFile;
  string outFile;
  string file;
  string dir;
  RegularExpression includeLine;
  RegularExpression glDirLine;
  ofstream fout;
  ifstream fin;
  RegularExpression glLine;
  char *local_788;
  long local_780;
  char local_778;
  undefined7 uStack_777;
  string local_768;
  string local_748;
  char *local_728;
  undefined8 local_720;
  char local_718;
  undefined7 uStack_717;
  long *local_708;
  long local_700;
  long local_6f8 [2];
  string local_6e8;
  string local_6c8;
  RegularExpression local_6a8;
  RegularExpression local_5d8;
  undefined1 local_508 [32];
  byte abStack_4e8 [216];
  ios_base local_410 [264];
  string local_308;
  byte abStack_2e8 [488];
  RegularExpression local_100;
  
  local_6c8._M_dataplus._M_p = (pointer)&local_6c8.field_2;
  local_6c8._M_string_length = 0;
  local_6c8.field_2._M_local_buf[0] = '\0';
  local_6e8._M_dataplus._M_p = (pointer)&local_6e8.field_2;
  local_6e8._M_string_length = 0;
  local_6e8.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&local_308,source,(allocator *)local_508);
  cmsys::SystemTools::SplitProgramPath(&local_308,&local_6c8,&local_6e8,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::string((string *)&local_708,outdir,(allocator *)&local_308);
  std::__cxx11::string::append((char *)&local_708);
  std::__cxx11::string::_M_append((char *)&local_708,(ulong)local_6e8._M_dataplus._M_p);
  local_748._M_dataplus._M_p = (pointer)&local_748.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_748,local_708,(long)local_708 + local_700);
  std::__cxx11::string::append((char *)&local_748);
  std::ofstream::ofstream(local_508,local_748._M_dataplus._M_p,_S_out);
  if ((abStack_4e8[(long)*(_func_int **)(local_508._0_8_ + -0x18)] & 5) == 0) {
    std::ifstream::ifstream(&local_308,source,_S_in);
    if ((abStack_2e8[*(long *)(local_308._M_dataplus._M_p + -0x18)] & 5) == 0) {
      local_768._M_dataplus._M_p = (pointer)&local_768.field_2;
      local_768._M_string_length = 0;
      local_768.field_2._M_local_buf[0] = '\0';
      local_6a8.program = (char *)0x0;
      cmsys::RegularExpression::compile(&local_6a8,"^[ \t]*#[ \t]*include[ \t]*[<\"]([^\">]+)[\">]")
      ;
      local_5d8.program = (char *)0x0;
      cmsys::RegularExpression::compile(&local_5d8,"(gl|GL)(/|\\\\)([^<\"]+)");
      local_100.program = (char *)0x0;
      cmsys::RegularExpression::compile(&local_100,"(gl|GL|xmesa)");
      while( true ) {
        bVar1 = cmsys::SystemTools::GetLineFromStream
                          ((istream *)&local_308,&local_768,(bool *)0x0,-1);
        if (!bVar1) break;
        bVar1 = cmsys::RegularExpression::find(&local_6a8,local_768._M_dataplus._M_p);
        if (bVar1) {
          local_728 = &local_718;
          if (local_6a8.startp[1] == (char *)0x0) {
            local_720 = 0;
            local_718 = '\0';
          }
          else {
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_728,local_6a8.startp[1],local_6a8.endp[1]);
          }
          bVar1 = cmsys::RegularExpression::find(&local_5d8,local_728);
          if (bVar1) {
            if (local_5d8.startp[3] == (char *)0x0) {
              local_788 = &local_778;
              local_780 = 0;
              local_778 = '\0';
            }
            else {
              local_788 = &local_778;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_788,local_5d8.startp[3],local_5d8.endp[3]);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_508,"#include \"",10);
            if (outdir == (char *)0x0) {
              std::ios::clear((int)&local_788 + (int)*(_func_int **)(local_508._0_8_ + -0x18) +
                              0x280);
            }
            else {
              sVar2 = strlen(outdir);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_508,outdir,sVar2);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_508,"/",1);
            poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_508,local_788,local_780);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"\n",2);
LAB_0034a6b6:
            if (local_788 != &local_778) {
              operator_delete(local_788,CONCAT71(uStack_777,local_778) + 1);
            }
          }
          else {
            bVar1 = cmsys::RegularExpression::find(&local_100,local_728);
            if (bVar1) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_508,"#include \"",10);
              if (outdir == (char *)0x0) {
                std::ios::clear((int)&local_788 + (int)*(_func_int **)(local_508._0_8_ + -0x18) +
                                0x280);
              }
              else {
                sVar2 = strlen(outdir);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_508,outdir,sVar2);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_508,"/",1);
              if (local_6a8.startp[1] == (char *)0x0) {
                local_788 = &local_778;
                local_780 = 0;
                local_778 = '\0';
              }
              else {
                local_788 = &local_778;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_788,local_6a8.startp[1],local_6a8.endp[1]);
              }
              poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_508,local_788,local_780);
              std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"\n",2);
              goto LAB_0034a6b6;
            }
            poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_508,local_768._M_dataplus._M_p,
                                local_768._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
          }
          if (local_728 != &local_718) {
            operator_delete(local_728,CONCAT71(uStack_717,local_718) + 1);
          }
        }
        else {
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_508,local_768._M_dataplus._M_p,
                              local_768._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
        }
      }
      std::ifstream::close();
      std::ofstream::close();
      cmSystemTools::CopyFileIfDifferent(local_748._M_dataplus._M_p,(char *)local_708);
      cmsys::SystemTools::RemoveFile(&local_748);
      if (local_100.program != (char *)0x0) {
        operator_delete__(local_100.program);
      }
      if (local_5d8.program != (char *)0x0) {
        operator_delete__(local_5d8.program);
      }
      if (local_6a8.program != (char *)0x0) {
        operator_delete__(local_6a8.program);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_768._M_dataplus._M_p != &local_768.field_2) {
        operator_delete(local_768._M_dataplus._M_p,
                        CONCAT71(local_768.field_2._M_allocated_capacity._1_7_,
                                 local_768.field_2._M_local_buf[0]) + 1);
      }
    }
    else {
      cmSystemTools::Error
                ("Could not open file for read in copy operation",source,(char *)0x0,(char *)0x0);
    }
    std::ifstream::~ifstream(&local_308);
  }
  else {
    cmSystemTools::Error
              ("Could not open file for write in copy operation: ",local_748._M_dataplus._M_p,outdir
               ,(char *)0x0);
    cmSystemTools::ReportLastSystemError("");
  }
  local_508._0_8_ = _VTT;
  *(undefined8 *)(local_508 + (long)_VTT[-3]) = _vtable;
  std::filebuf::~filebuf((filebuf *)(local_508 + 8));
  std::ios_base::~ios_base(local_410);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_748._M_dataplus._M_p != &local_748.field_2) {
    operator_delete(local_748._M_dataplus._M_p,local_748.field_2._M_allocated_capacity + 1);
  }
  if (local_708 != local_6f8) {
    operator_delete(local_708,local_6f8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6e8._M_dataplus._M_p != &local_6e8.field_2) {
    operator_delete(local_6e8._M_dataplus._M_p,
                    CONCAT71(local_6e8.field_2._M_allocated_capacity._1_7_,
                             local_6e8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6c8._M_dataplus._M_p != &local_6c8.field_2) {
    operator_delete(local_6c8._M_dataplus._M_p,
                    CONCAT71(local_6c8.field_2._M_allocated_capacity._1_7_,
                             local_6c8.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void cmUseMangledMesaCommand::CopyAndFullPathMesaHeader(const char* source,
                                                        const char* outdir)
{
  std::string dir, file;
  cmSystemTools::SplitProgramPath(source, dir, file);
  std::string outFile = outdir;
  outFile += "/";
  outFile += file;
  std::string tempOutputFile = outFile;
  tempOutputFile += ".tmp";
  cmsys::ofstream fout(tempOutputFile.c_str());
  if (!fout) {
    cmSystemTools::Error("Could not open file for write in copy operation: ",
                         tempOutputFile.c_str(), outdir);
    cmSystemTools::ReportLastSystemError("");
    return;
  }
  cmsys::ifstream fin(source);
  if (!fin) {
    cmSystemTools::Error("Could not open file for read in copy operation",
                         source);
    return;
  }
  // now copy input to output and expand variables in the
  // input file at the same time
  std::string inLine;
  // regular expression for any #include line
  cmsys::RegularExpression includeLine(
    "^[ \t]*#[ \t]*include[ \t]*[<\"]([^\">]+)[\">]");
  // regular expression for gl/ or GL/ in a file (match(1) of above)
  cmsys::RegularExpression glDirLine("(gl|GL)(/|\\\\)([^<\"]+)");
  // regular expression for gl GL or xmesa in a file (match(1) of above)
  cmsys::RegularExpression glLine("(gl|GL|xmesa)");
  while (cmSystemTools::GetLineFromStream(fin, inLine)) {
    if (includeLine.find(inLine.c_str())) {
      std::string includeFile = includeLine.match(1);
      if (glDirLine.find(includeFile.c_str())) {
        std::string gfile = glDirLine.match(3);
        fout << "#include \"" << outdir << "/" << gfile << "\"\n";
      } else if (glLine.find(includeFile.c_str())) {
        fout << "#include \"" << outdir << "/" << includeLine.match(1)
             << "\"\n";
      } else {
        fout << inLine << "\n";
      }
    } else {
      fout << inLine << "\n";
    }
  }
  // close the files before attempting to copy
  fin.close();
  fout.close();
  cmSystemTools::CopyFileIfDifferent(tempOutputFile.c_str(), outFile.c_str());
  cmSystemTools::RemoveFile(tempOutputFile);
}